

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O3

bool QGenericUnixTheme::isDBusGlobalMenuAvailable(void)

{
  if (isDBusGlobalMenuAvailable()::dbusGlobalMenuAvailable == '\0') {
    isDBusGlobalMenuAvailable();
  }
  return isDBusGlobalMenuAvailable::dbusGlobalMenuAvailable;
}

Assistant:

bool QGenericUnixTheme::isDBusGlobalMenuAvailable()
{
    static bool dbusGlobalMenuAvailable = checkDBusGlobalMenuAvailable();
    return dbusGlobalMenuAvailable;
}